

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

void __thiscall
mkvparser::Track::Track(Track *this,Segment *pSegment,longlong element_start,longlong element_size)

{
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  Info *this_00;
  
  *in_RDI = &PTR__Track_00c9e8a8;
  in_RDI[1] = in_RSI;
  in_RDI[2] = in_RDX;
  in_RDI[3] = in_RCX;
  this_00 = (Info *)(in_RDI + 4);
  Info::Info(this_00);
  EOSBlock::EOSBlock((EOSBlock *)this_00);
  in_RDI[0x16] = 0;
  in_RDI[0x17] = 0;
  return;
}

Assistant:

Track::Track(Segment* pSegment, long long element_start, long long element_size)
    : m_pSegment(pSegment),
      m_element_start(element_start),
      m_element_size(element_size),
      content_encoding_entries_(NULL),
      content_encoding_entries_end_(NULL) {}